

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

void __thiscall
kj::Function<void_(unsigned_int,_unsigned_int)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:3147:19)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:3147:19)>
             *this,uint params,uint params_1)

{
  uint runningCount;
  uint *puVar1;
  uint local_18;
  uint local_14;
  uint params_local_1;
  uint params_local;
  Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:3147:19)>
  *this_local;
  
  local_18 = params_1;
  local_14 = params;
  _params_local_1 = this;
  puVar1 = fwd<unsigned_int>(&local_14);
  runningCount = *puVar1;
  puVar1 = fwd<unsigned_int>(&local_18);
  NoInfer_<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:3147:19)>
  ::Type::operator()(&this->f,runningCount,*puVar1);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }